

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall t_ocaml_generator::generate_typedef(t_ocaml_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  string *psVar2;
  t_type *ptVar3;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  t_typedef *local_18;
  t_typedef *ttypedef_local;
  t_ocaml_generator *this_local;
  
  local_18 = ttypedef;
  ttypedef_local = (t_typedef *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"type ");
  psVar2 = t_typedef::get_symbolic_abi_cxx11_(local_18);
  std::__cxx11::string::string((string *)&local_88,(string *)psVar2);
  t_generator::decapitalize(&local_68,(t_generator *)this,&local_88);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1," = ");
  ptVar3 = t_typedef::get_type(local_18);
  render_ocaml_type_abi_cxx11_(&local_a8,this,ptVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_i_,(string *)&local_c8);
  poVar1 = std::operator<<(poVar1,"type ");
  psVar2 = t_typedef::get_symbolic_abi_cxx11_(local_18);
  std::__cxx11::string::string((string *)&local_108,(string *)psVar2);
  t_generator::decapitalize(&local_e8,(t_generator *)this,&local_108);
  poVar1 = std::operator<<(poVar1,(string *)&local_e8);
  poVar1 = std::operator<<(poVar1," = ");
  ptVar3 = t_typedef::get_type(local_18);
  render_ocaml_type_abi_cxx11_(&local_128,this,ptVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_128);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void t_ocaml_generator::generate_typedef(t_typedef* ttypedef) {
  f_types_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
           << render_ocaml_type(ttypedef->get_type()) << endl << endl;
  f_types_i_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
             << render_ocaml_type(ttypedef->get_type()) << endl << endl;
}